

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

void __thiscall sznet::net::TcpConnection::connectDestroyed(TcpConnection *this)

{
  EventLoop *this_00;
  Channel *this_01;
  bool bVar1;
  undefined8 uVar2;
  shared_ptr<sznet::net::TcpConnection> *in_RSI;
  shared_ptr<sznet::net::TcpConnection> local_28;
  
  this_00 = this->m_loop;
  bVar1 = EventLoop::isInLoopThread(this_00);
  if (!bVar1) {
    EventLoop::abortNotInLoopThread(this_00);
  }
  if (this->m_state == kConnected) {
    this->m_state = kDisconnected;
    this_01 = (this->m_channel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    this_01->m_events = 0;
    Channel::update(this_01);
    std::__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::TcpConnection,void>
              ((__shared_ptr<sznet::net::TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               (__weak_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    if ((this->m_connectionCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if (local_28.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_28.
                   super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      _Unwind_Resume(uVar2);
    }
    in_RSI = &local_28;
    (*(this->m_connectionCallback)._M_invoker)((_Any_data *)&this->m_connectionCallback,in_RSI);
    if (local_28.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_28.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  Channel::remove((this->m_channel)._M_t.
                  super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                  .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,(char *)in_RSI);
  return;
}

Assistant:

void TcpConnection::connectDestroyed()
{
	m_loop->assertInLoopThread();
	if (m_state == kConnected)
	{
		setState(kDisconnected);
		m_channel->disableAll();

		m_connectionCallback(shared_from_this());
	}
	m_channel->remove();
}